

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O0

void anon_unknown.dwarf_e2e38::compareBufferRelative
               (SimdAlignedBuffer64f *src,SimdAlignedBuffer64f *dst,float relErrThresh,
               float absErrThresh)

{
  float fVar1;
  ostream *poVar2;
  void *pvVar3;
  long *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar4;
  SimdAlignedBuffer64f *pSVar5;
  float in_XMM1_Da;
  double relDiff;
  double diff;
  int i;
  SimdAlignedBuffer64f *in_stack_ffffffffffffffc0;
  double local_38;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (0x3f < local_1c) {
      return;
    }
    dVar4 = std::fabs((double)(ulong)(uint)(*(float *)(*in_RDI + (long)local_1c * 4) -
                                           *(float *)(*in_RSI + (long)local_1c * 4)));
    pSVar5 = (SimdAlignedBuffer64f *)(double)SUB84(dVar4,0);
    fVar1 = *(float *)(*in_RDI + (long)local_1c * 4);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      in_stack_ffffffffffffffc0 = pSVar5;
      dVar4 = std::fabs((double)(ulong)*(uint *)(*in_RDI + (long)local_1c * 4));
      local_38 = (double)in_stack_ffffffffffffffc0 / (double)SUB84(dVar4,0);
    }
    else {
      local_38 = 0.0;
    }
    if (((double)in_XMM0_Da < local_38) && ((double)in_XMM1_Da < (double)pSVar5)) break;
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<(&std::cout,std::scientific);
  poVar2 = std::operator<<((ostream *)&std::cout,"Error exceeded threshold on element ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_1c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," diff: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)pSVar5);
  poVar2 = std::operator<<(poVar2," relErr: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_38 * 100.0);
  poVar2 = std::operator<<(poVar2," %");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Goal (src): ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::scientific);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  dumpBuffer(in_stack_ffffffffffffffc0);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test (dst): ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dumpBuffer(in_stack_ffffffffffffffc0);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDwaCompressorSimd.cpp"
                ,0x59,
                "void (anonymous namespace)::compareBufferRelative(const SimdAlignedBuffer64f &, const SimdAlignedBuffer64f &, const float, const float)"
               );
}

Assistant:

void
compareBufferRelative (
    const SimdAlignedBuffer64f& src,
    const SimdAlignedBuffer64f& dst,
    const float                 relErrThresh,
    const float                 absErrThresh)
{
    for (int i = 0; i < 64; ++i)
    {

        double diff    = fabs (src._buffer[i] - dst._buffer[i]);
        double relDiff = src._buffer[i] == 0 ? 0.0
                                             : diff / fabs (src._buffer[i]);

        if (relDiff > relErrThresh && diff > absErrThresh)
        {
            cout << scientific;
            cout << "Error exceeded threshold on element " << i << endl;
            cout << " diff: " << diff << " relErr: " << fixed << 100.0 * relDiff
                 << " %" << endl;
            cout << "Goal (src): " << scientific << endl;
            dumpBuffer (src);
            cout << "Test (dst): " << endl;
            dumpBuffer (dst);

            assert (false);
        }
    }
}